

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

Result * __thiscall
httplib::ClientImpl::send_with_content_provider
          (Result *__return_storage_ptr__,ClientImpl *this,string *method,string *path,
          Headers *headers,char *body,size_t content_length,ContentProvider content_provider,
          ContentProviderWithoutLength content_provider_without_length,string *content_type)

{
  _Rb_tree_header *p_Var1;
  code *pcVar2;
  _Rep_type *p_Var3;
  Error error;
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> res;
  string local_2d8;
  _Any_data local_2b8;
  code *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  char *local_290;
  undefined1 local_288 [32];
  string local_268 [8];
  undefined1 local_260 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  _Alloc_hider local_218;
  _Base_ptr local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  int local_1d8;
  _Alloc_hider local_1d0;
  size_t local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Rb_tree_node_base local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Rb_tree_color local_130 [2];
  _Base_ptr local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [160];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_60;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  undefined8 local_38;
  
  local_288._0_8_ = local_288 + 0x10;
  local_288._8_8_ = 0;
  local_288[0x10] = '\0';
  local_268 = (string  [8])(local_260 + 8);
  local_260._0_8_ = 0;
  local_260[8] = '\0';
  local_248._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_248._M_impl.super__Rb_tree_header._M_header;
  local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218._M_p = (pointer)&local_208;
  local_210 = (_Base_ptr)0x0;
  local_208._M_local_buf[0] = '\0';
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8 = -1;
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0._M_allocated_capacity._0_4_ = 0xffffffff;
  local_1b0._8_8_ = &local_198;
  local_1a0._M_p = (pointer)0x0;
  local_198._M_local_buf[0] = '\0';
  local_188 = &local_178;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  local_160._M_left = &local_160;
  local_160._M_color = _S_red;
  local_160._M_parent = (_Base_ptr)0x0;
  local_140._M_allocated_capacity = 0;
  local_120._M_allocated_capacity = (size_type)local_130;
  local_130[0] = _S_red;
  local_128 = (_Base_ptr)0x0;
  local_2a0._8_8_ = this;
  local_290 = body;
  local_248._M_impl.super__Rb_tree_header._M_header._M_right =
       local_248._M_impl.super__Rb_tree_header._M_header._M_left;
  local_160._M_right = local_160._M_left;
  local_120._8_8_ = local_120._M_allocated_capacity;
  memset(local_110,0,0xa0);
  local_70._M_p = (pointer)0x14;
  local_38 = 0;
  local_68 = 0;
  aStack_60._M_allocated_capacity = 0;
  aStack_60._8_8_ = 0;
  uStack_50 = 0;
  uStack_4f = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  std::__cxx11::string::_M_assign((string *)local_288);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_248,&headers->_M_t);
  std::__cxx11::string::_M_assign(local_268);
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2a8 = (code *)0x0;
  local_2a0._M_allocated_capacity =
       *(undefined8 *)
        (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18);
  pcVar2 = *(code **)(content_provider.super__Function_base._M_functor._M_unused._M_function_pointer
                     + 0x10);
  if (pcVar2 != (code *)0x0) {
    local_2b8._M_unused._0_8_ =
         (undefined8)*content_provider.super__Function_base._M_functor._M_unused._M_object;
    local_2b8._8_8_ =
         *(undefined8 *)
          (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
    *(undefined8 *)
     (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) = 0;
    *(undefined8 *)
     (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18) = 0;
    local_2a8 = pcVar2;
  }
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_2d8.field_2._8_8_ =
       *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x18);
  pcVar2 = *(code **)(content_provider.super__Function_base._M_functor._8_8_ + 0x10);
  if (pcVar2 != (code *)0x0) {
    local_2d8._M_dataplus._M_p = *(pointer *)content_provider.super__Function_base._M_functor._8_8_;
    local_2d8._M_string_length =
         *(size_type *)(content_provider.super__Function_base._M_functor._8_8_ + 8);
    *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x10) = 0;
    *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x18) = 0;
    local_2d8.field_2._M_allocated_capacity = (size_type)pcVar2;
  }
  send_with_content_provider
            ((ClientImpl *)&res,(Request *)local_2a0._8_8_,local_288,(size_t)local_290,
             (ContentProvider *)content_length,(ContentProviderWithoutLength *)&local_2b8,&local_2d8
             ,(Error *)content_provider.super__Function_base._M_manager);
  if ((code *)local_2d8.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_2d8.field_2._M_allocated_capacity)(&local_2d8,&local_2d8,3);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  (__return_storage_ptr__->res_)._M_t.
  super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (Response *)
       res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
       _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0;
  __return_storage_ptr__->err_ = Success;
  p_Var1 = &(__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header;
  if (local_248._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = &p_Var1->_M_header;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = &p_Var1->_M_header;
    p_Var3 = &(__return_storage_ptr__->request_headers_)._M_t;
  }
  else {
    p_Var3 = &local_248;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = local_248._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_248._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_248._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = local_248._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_248._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_248._M_impl.super__Rb_tree_header._M_node_count;
    local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_248._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_248._M_impl.super__Rb_tree_header._M_header;
    local_248._M_impl.super__Rb_tree_header._M_header._M_right =
         local_248._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  (p_Var3->_M_impl).super__Rb_tree_header._M_node_count = 0;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr(&res);
  Request::~Request((Request *)local_288);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::send_with_content_provider(
    const std::string &method, const std::string &path, const Headers &headers,
    const char *body, size_t content_length, ContentProvider content_provider,
    ContentProviderWithoutLength content_provider_without_length,
    const std::string &content_type) {
  Request req;
  req.method = method;
  req.headers = headers;
  req.path = path;

  auto error = Error::Success;

  auto res = send_with_content_provider(
      req, body, content_length, std::move(content_provider),
      std::move(content_provider_without_length), content_type, error);

  return Result{std::move(res), error, std::move(req.headers)};
}